

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

err_t bignParamsStd(bign_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  undefined4 local_4;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    memSet(in_RDI,(octet)((ulong)in_RSI >> 0x38),0x14592f);
    iVar2 = strCmp(in_RDI,in_RSI);
    if (iVar2 == 0) {
      in_RDI[0] = -0x80;
      in_RDI[1] = '\0';
      in_RDI[2] = '\0';
      in_RDI[3] = '\0';
      in_RDI[4] = '\0';
      in_RDI[5] = '\0';
      in_RDI[6] = '\0';
      in_RDI[7] = '\0';
      memCopy(in_RDI,in_RSI,0x14596e);
      memCopy(in_RDI,in_RSI,0x145988);
      memCopy(in_RDI,in_RSI,0x1459a5);
      memCopy(in_RDI,in_RSI,0x1459c2);
      memCopy(in_RDI,in_RSI,0x1459df);
      memCopy(in_RDI,in_RSI,0x1459fc);
      local_4 = 0;
    }
    else {
      iVar2 = strCmp(in_RDI,in_RSI);
      if (iVar2 == 0) {
        in_RDI[0] = -0x40;
        in_RDI[1] = '\0';
        in_RDI[2] = '\0';
        in_RDI[3] = '\0';
        in_RDI[4] = '\0';
        in_RDI[5] = '\0';
        in_RDI[6] = '\0';
        in_RDI[7] = '\0';
        memCopy(in_RDI,in_RSI,0x145a48);
        memCopy(in_RDI,in_RSI,0x145a62);
        memCopy(in_RDI,in_RSI,0x145a7f);
        memCopy(in_RDI,in_RSI,0x145a9c);
        memCopy(in_RDI,in_RSI,0x145ab9);
        memCopy(in_RDI,in_RSI,0x145ad6);
        local_4 = 0;
      }
      else {
        iVar2 = strCmp(in_RDI,in_RSI);
        if (iVar2 == 0) {
          in_RDI[0] = '\0';
          in_RDI[1] = '\x01';
          in_RDI[2] = '\0';
          in_RDI[3] = '\0';
          in_RDI[4] = '\0';
          in_RDI[5] = '\0';
          in_RDI[6] = '\0';
          in_RDI[7] = '\0';
          memCopy(in_RDI,in_RSI,0x145b22);
          memCopy(in_RDI,in_RSI,0x145b3c);
          memCopy(in_RDI,in_RSI,0x145b59);
          memCopy(in_RDI,in_RSI,0x145b76);
          memCopy(in_RDI,in_RSI,0x145b93);
          memCopy(in_RDI,in_RSI,0x145bb0);
          local_4 = 0;
        }
        else {
          local_4 = 0xca;
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t bignParamsStd(bign_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(bign_params));
	if (strEq(name, _curve128v1_name))
	{
		params->l = 128;
		memCopy(params->p, _curve128v1_p, 32);
		memCopy(params->a, _curve128v1_a, 32);
		memCopy(params->seed, _curve128v1_seed, 8);
		memCopy(params->b, _curve128v1_b, 32);
		memCopy(params->q, _curve128v1_q, 32);
		memCopy(params->yG, _curve128v1_yG, 32);
		return ERR_OK;
	}
	if (strEq(name, _curve192v1_name))
	{
		params->l = 192;
		memCopy(params->p, _curve192v1_p, 48);
		memCopy(params->a, _curve192v1_a, 48);
		memCopy(params->seed, _curve192v1_seed, 8);
		memCopy(params->b, _curve192v1_b, 48);
		memCopy(params->q, _curve192v1_q, 48);
		memCopy(params->yG, _curve192v1_yG, 48);
		return ERR_OK;
	}
	if (strEq(name, _curve256v1_name))
	{
		params->l = 256;
		memCopy(params->p, _curve256v1_p, 64);
		memCopy(params->a, _curve256v1_a, 64);
		memCopy(params->seed, _curve256v1_seed, 8);
		memCopy(params->b, _curve256v1_b, 64);
		memCopy(params->q, _curve256v1_q, 64);
		memCopy(params->yG, _curve256v1_yG, 64);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}